

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::ExtractCompoundObject
               (SnapObject *sobj,RecyclableObject *obj,bool isWellKnown,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap,
               SlabAllocator *alloc)

{
  Type *id;
  bool bVar1;
  BOOL BVar2;
  SnapObjectType SVar3;
  TTD_WELLKNOWN_TOKEN str;
  char16 *pcVar4;
  Entry *pEVar5;
  
  BVar2 = Js::RecyclableObject::IsExternal(obj);
  if (BVar2 != 0) {
    TTDAbort_unrecoverable_error("We are not prepared for custom external objects yet");
  }
  sobj->ObjectPtrId = (TTD_PTR_ID)obj;
  SVar3 = SnapAwaitObject;
  if (((obj->type).ptr)->typeId != TypeIds_AwaitObject) {
    SVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x5f])(obj);
  }
  sobj->SnapObjectTag = SVar3;
  if (isWellKnown) {
    str = RuntimeContextInfo::ResolvePathForKnownObject
                    (((((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                      scriptContext.ptr)->TTDWellKnownInfo,obj);
  }
  else {
    str = (char16 *)0x0;
  }
  pcVar4 = SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,str);
  sobj->OptWellKnownToken = pcVar4;
  id = (obj->type).ptr;
  pEVar5 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::FindSlotForId<false>
                     (idToTypeMap,(unsigned_long)id);
  sobj->SnapType = pEVar5->Data;
  bVar1 = Js::StaticType::Is(id->typeId);
  if (bVar1) {
    sobj->OptIndexedObjectArray = 0;
    sobj->OptDependsOnInfo = (DependsOnInfo *)0x0;
    sobj->IsCrossSite = 0;
    sobj->VarArrayCount = 0;
    sobj->VarArray = (TTDVar *)0x0;
  }
  else {
    StdPropertyExtract_DynamicType(sobj,(DynamicObject *)obj,alloc);
  }
  if (sobj->SnapObjectTag == SnapAwaitObject) {
    return;
  }
  (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x60])
            (obj,sobj,alloc);
  return;
}

Assistant:

void ExtractCompoundObject(NSSnapObjects::SnapObject* sobj, Js::RecyclableObject* obj, bool isWellKnown, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& idToTypeMap, SlabAllocator& alloc)
        {
            TTDAssert(!obj->IsExternal(), "We are not prepared for custom external objects yet");

            sobj->ObjectPtrId = TTD_CONVERT_VAR_TO_PTR_ID(obj);
            sobj->SnapObjectTag = obj->GetTypeId() == Js::TypeId::TypeIds_AwaitObject ? SnapObjectType::SnapAwaitObject : obj->GetSnapTag_TTD();

            TTD_WELLKNOWN_TOKEN lookupToken = isWellKnown ? obj->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownObject(obj) : TTD_INVALID_WELLKNOWN_TOKEN;
            sobj->OptWellKnownToken = alloc.CopyRawNullTerminatedStringInto(lookupToken);

            Js::Type* objType = obj->GetType();
            sobj->SnapType = idToTypeMap.LookupKnownItem(TTD_CONVERT_TYPEINFO_TO_PTR_ID(objType));

#if ENABLE_OBJECT_SOURCE_TRACKING
            InitializeDiagnosticOriginInformation(sobj->DiagOriginInfo);
#endif

            if(Js::StaticType::Is(objType->GetTypeId()))
            {
                NSSnapObjects::StdPropertyExtract_StaticType(sobj, obj);
            }
            else
            {
                NSSnapObjects::StdPropertyExtract_DynamicType(sobj, static_cast<Js::DynamicObject*>(obj), alloc);
            }

            if (sobj->SnapObjectTag != SnapObjectType::SnapAwaitObject)
            {
                obj->ExtractSnapObjectDataInto(sobj, alloc);
            }
        }